

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::charOrIntOrRange(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *pAVar1;
  RefAST RVar2;
  int iVar3;
  uint uVar4;
  NoViableAltException *pNVar5;
  RefAST tmp142_AST;
  RefAST tmp139_AST;
  RefAST charOrIntOrRange_AST;
  ASTPair currentAST;
  RefCount<Token> local_98;
  RefCount<Token> local_90;
  RefCount<Token> local_88;
  RefCount<Token> local_80;
  RefCount<Token> local_78;
  RefToken local_70;
  RefToken local_68;
  RefAST local_60;
  RefAST local_58;
  RefAST local_50;
  RefToken local_48;
  RefAST local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  charOrIntOrRange_AST = nullAST;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  tmp139_AST = nullAST;
  if (iVar3 == 0x11) {
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    ASTFactory::create((ASTFactory *)&tmp142_AST,(RefToken *)pAVar1);
    RefCount<AST>::operator=(&tmp139_AST,&tmp142_AST);
    RefCount<AST>::~RefCount(&tmp142_AST);
    RefCount<Token>::~RefCount(&local_80);
    if (tmp139_AST.ref != (Ref *)0x0) {
      (tmp139_AST.ref)->count = (tmp139_AST.ref)->count + 1;
    }
    local_40.ref = tmp139_AST.ref;
    ASTFactory::addASTChild(pAVar1,&currentAST,&local_40);
    RefCount<AST>::~RefCount(&local_40);
    Parser::match((Parser *)this,0x11);
  }
  else {
    if (iVar3 != 0x21) {
      pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_48,this,1);
      NoViableAltException::NoViableAltException(pNVar5,&local_48);
      __cxa_throw(pNVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    ASTFactory::create((ASTFactory *)&tmp142_AST,(RefToken *)pAVar1);
    RefCount<AST>::operator=(&tmp139_AST,&tmp142_AST);
    RefCount<AST>::~RefCount(&tmp142_AST);
    RefCount<Token>::~RefCount(&local_78);
    if (tmp139_AST.ref != (Ref *)0x0) {
      (tmp139_AST.ref)->count = (tmp139_AST.ref)->count + 1;
    }
    local_38.ref = tmp139_AST.ref;
    ASTFactory::addASTChild(pAVar1,&currentAST,&local_38);
    RefCount<AST>::~RefCount(&local_38);
    Parser::match((Parser *)this,0x21);
  }
  RefCount<AST>::~RefCount(&tmp139_AST);
  uVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  RVar2 = nullAST;
  if (uVar4 < 0x22) {
    if ((0x200320080U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
      if ((ulong)uVar4 != 0x20) goto LAB_00177cca;
      if (nullAST.ref != (Ref *)0x0) {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      tmp139_AST = RVar2;
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_88,this,1);
      pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
      ASTFactory::create((ASTFactory *)&tmp142_AST,(RefToken *)pAVar1);
      RefCount<AST>::operator=(&tmp139_AST,&tmp142_AST);
      RefCount<AST>::~RefCount(&tmp142_AST);
      RefCount<Token>::~RefCount(&local_88);
      if (tmp139_AST.ref != (Ref *)0x0) {
        (tmp139_AST.ref)->count = (tmp139_AST.ref)->count + 1;
      }
      local_50.ref = tmp139_AST.ref;
      ASTFactory::makeASTRoot(pAVar1,&currentAST,&local_50);
      RefCount<AST>::~RefCount(&local_50);
      Parser::match((Parser *)this,0x20);
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      tmp142_AST = nullAST;
      if (iVar3 == 0x11) {
        if (nullAST.ref != (Ref *)0x0) {
          (nullAST.ref)->count = (nullAST.ref)->count + 1;
        }
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_98,this,1);
        ASTFactory::create((ASTFactory *)&stack0xffffffffffffff48,(RefToken *)pAVar1);
        RefCount<AST>::operator=(&tmp142_AST,(RefCount<AST> *)&stack0xffffffffffffff48);
        RefCount<AST>::~RefCount((RefCount<AST> *)&stack0xffffffffffffff48);
        RefCount<Token>::~RefCount(&local_98);
        if (tmp142_AST.ref != (Ref *)0x0) {
          (tmp142_AST.ref)->count = (tmp142_AST.ref)->count + 1;
        }
        local_60.ref = tmp142_AST.ref;
        ASTFactory::addASTChild(pAVar1,&currentAST,&local_60);
        RefCount<AST>::~RefCount(&local_60);
        Parser::match((Parser *)this,0x11);
      }
      else {
        if (iVar3 != 0x21) {
          pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
          (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_68,this,1);
          NoViableAltException::NoViableAltException(pNVar5,&local_68);
          __cxa_throw(pNVar5,&NoViableAltException::typeinfo,
                      NoViableAltException::~NoViableAltException);
        }
        if (nullAST.ref != (Ref *)0x0) {
          (nullAST.ref)->count = (nullAST.ref)->count + 1;
        }
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_90,this,1);
        ASTFactory::create((ASTFactory *)&stack0xffffffffffffff48,(RefToken *)pAVar1);
        RefCount<AST>::operator=(&tmp142_AST,(RefCount<AST> *)&stack0xffffffffffffff48);
        RefCount<AST>::~RefCount((RefCount<AST> *)&stack0xffffffffffffff48);
        RefCount<Token>::~RefCount(&local_90);
        if (tmp142_AST.ref != (Ref *)0x0) {
          (tmp142_AST.ref)->count = (tmp142_AST.ref)->count + 1;
        }
        local_58.ref = tmp142_AST.ref;
        ASTFactory::addASTChild(pAVar1,&currentAST,&local_58);
        RefCount<AST>::~RefCount(&local_58);
        Parser::match((Parser *)this,0x21);
      }
      RefCount<AST>::~RefCount(&tmp142_AST);
      RefCount<AST>::~RefCount(&tmp139_AST);
    }
    RefCount<AST>::operator=(&charOrIntOrRange_AST,&currentAST.root);
    RefCount<AST>::operator=(this_00,&charOrIntOrRange_AST);
    RefCount<AST>::~RefCount(&charOrIntOrRange_AST);
    ASTPair::~ASTPair(&currentAST);
    return;
  }
LAB_00177cca:
  pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_70,this,1);
  NoViableAltException::NoViableAltException(pNVar5,&local_70);
  __cxa_throw(pNVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::charOrIntOrRange() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST charOrIntOrRange_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case LIT_CHAR:
		{
			RefAST tmp139_AST = nullAST;
			tmp139_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp139_AST);
			match(LIT_CHAR);
			break;
		}
		case LIT_INT:
		{
			RefAST tmp140_AST = nullAST;
			tmp140_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp140_AST);
			match(LIT_INT);
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		switch ( LA(1)) {
		case OP_DOTDOT:
		{
			RefAST tmp141_AST = nullAST;
			tmp141_AST = astFactory.create(LT(1));
			astFactory.makeASTRoot(currentAST, tmp141_AST);
			match(OP_DOTDOT);
			{
			switch ( LA(1)) {
			case LIT_CHAR:
			{
				RefAST tmp142_AST = nullAST;
				tmp142_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp142_AST);
				match(LIT_CHAR);
				break;
			}
			case LIT_INT:
			{
				RefAST tmp143_AST = nullAST;
				tmp143_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp143_AST);
				match(LIT_INT);
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			break;
		}
		case OP_RPAREN:
		case LIT_INT:
		case LIT_STRING:
		case OP_COMMA:
		case LIT_CHAR:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		charOrIntOrRange_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_38);
	}
	returnAST = charOrIntOrRange_AST;
}